

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O1

void __thiscall
AnalyserExternalVariable_removeAllDependencies_Test::
~AnalyserExternalVariable_removeAllDependencies_Test
          (AnalyserExternalVariable_removeAllDependencies_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, removeAllDependencies)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    externalVariable->addDependency(model->component("membrane")->variable("i_Na"));
    externalVariable->addDependency(model->component("membrane")->variable("i_K"));
    externalVariable->addDependency(model->component("membrane")->variable("i_L"));

    EXPECT_EQ(size_t(3), externalVariable->dependencyCount());

    externalVariable->removeAllDependencies();

    EXPECT_EQ(size_t(0), externalVariable->dependencyCount());
}